

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

int beagleCreateInstance
              (int tipCount,int partialsBufferCount,int compactBufferCount,int stateCount,
              int patternCount,int eigenBufferCount,int matrixBufferCount,int categoryCount,
              int scaleBufferCount,int *resourceList,int resourceCount,long preferenceFlags,
              long requirementFlags,BeagleInstanceDetails *returnInfo)

{
  pointer *pppBVar1;
  _List_node_base *p_Var2;
  undefined8 *puVar3;
  _List_node_base *p_Var4;
  iterator __position;
  pointer ppBVar5;
  int iVar6;
  vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *pvVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  mapped_type *pmVar10;
  BeagleImpl *pBVar11;
  undefined4 in_register_0000008c;
  BeagleImpl *bestBeagle;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int resource;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,eigenBufferCount);
  local_54 = tipCount;
  local_50 = partialsBufferCount;
  local_4c = compactBufferCount;
  local_48 = stateCount;
  local_44 = patternCount;
  if (instances == (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)0x0) {
    pvVar7 = (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)
             operator_new(0x18);
    (pvVar7->super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instances = pvVar7;
    (pvVar7->super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar7->super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  loaded = 1;
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8->_M_prev = p_Var8;
  p_Var8->_M_next = p_Var8;
  p_Var8[1]._M_next = (_List_node_base *)0x0;
  iVar6 = filterResources(resourceList,resourceCount,preferenceFlags,requirementFlags,
                          (PairedList *)p_Var8);
  if (iVar6 == 0) {
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9->_M_prev = p_Var9;
    p_Var9->_M_next = p_Var9;
    p_Var9[1]._M_next = (_List_node_base *)0x0;
    rankResourceImplementationPairs
              (preferenceFlags,requirementFlags,(PairedList *)p_Var8,(RsrcImplList *)p_Var9);
    p_Var4 = p_Var8->_M_next;
    while (p_Var4 != p_Var8) {
      p_Var2 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var4);
      p_Var4 = p_Var2;
    }
    operator_delete(p_Var8);
    bestBeagle = (BeagleImpl *)0x0;
    local_3c = -6;
    p_Var8 = p_Var9;
    do {
      p_Var8 = (((_List_base<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                  *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var8 == p_Var9) {
        pBVar11 = (BeagleImpl *)0x0;
        break;
      }
      iVar6 = *(int *)&p_Var8[1]._M_prev;
      puVar3 = &(p_Var8[2]._M_next)->_M_next;
      resource = iVar6;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&ResourceMap,&resource);
      pBVar11 = (BeagleImpl *)
                (**(code **)*puVar3)
                          (puVar3,local_54,local_50,local_4c,local_48,local_44,local_38,
                           matrixBufferCount,categoryCount,scaleBufferCount,iVar6,*pmVar10,
                           preferenceFlags,requirementFlags,&local_3c);
      bestBeagle = pBVar11;
    } while (pBVar11 == (BeagleImpl *)0x0);
    p_Var8 = p_Var9->_M_next;
    while (p_Var8 != p_Var9) {
      p_Var4 = p_Var8->_M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var4;
    }
    operator_delete(p_Var9);
    pvVar7 = instances;
    if (pBVar11 != (BeagleImpl *)0x0) {
      __position._M_current =
           (instances->
           super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      ppBVar5 = (instances->
                super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (__position._M_current ==
          (instances->
          super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<beagle::BeagleImpl*,std::allocator<beagle::BeagleImpl*>>::
        _M_realloc_insert<beagle::BeagleImpl*const&>
                  ((vector<beagle::BeagleImpl*,std::allocator<beagle::BeagleImpl*>> *)instances,
                   __position,&bestBeagle);
        pBVar11 = bestBeagle;
      }
      else {
        *__position._M_current = pBVar11;
        pppBVar1 = &(pvVar7->
                    super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      local_3c = (**(code **)(*(long *)pBVar11 + 0x18))(pBVar11,returnInfo);
      if (local_3c == 0) {
        local_3c = (int)((ulong)((long)__position._M_current - (long)ppBVar5) >> 3);
        returnInfo->resourceName = rsrcList->list[returnInfo->resourceNumber].name;
        returnInfo->implDescription = "none";
      }
    }
  }
  else {
    p_Var4 = p_Var8->_M_next;
    while (p_Var4 != p_Var8) {
      p_Var9 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var4);
      p_Var4 = p_Var9;
    }
    operator_delete(p_Var8);
    local_3c = iVar6;
  }
  return local_3c;
}

Assistant:

int beagleCreateInstance(int tipCount,
                         int partialsBufferCount,
                         int compactBufferCount,
                         int stateCount,
                         int patternCount,
                         int eigenBufferCount,
                         int matrixBufferCount,
                         int categoryCount,
                         int scaleBufferCount,
                         int* resourceList,
                         int resourceCount,
                         long preferenceFlags,
                         long requirementFlags,
                         BeagleInstanceDetails* returnInfo) {
    DEBUG_CREATE_TIME();
    try {
        if (instances == NULL)
            instances = new std::vector<beagle::BeagleImpl*>;

        if (rsrcList == NULL)
            beagleGetResourceList();

        if (implFactory == NULL)
            beagleGetFactoryList();

        loaded = 1;

        int errorCode = BEAGLE_SUCCESS;

        PairedList* possibleResources = new PairedList;

        errorCode = filterResources(resourceList,
                                    resourceCount,
                                    preferenceFlags,
                                    requirementFlags,
                                    possibleResources);

        if (errorCode != BEAGLE_SUCCESS) {
            delete possibleResources;
            return errorCode;
        }

        RsrcImplList* possibleResourceImplementations = new RsrcImplList;

        errorCode = rankResourceImplementationPairs(preferenceFlags,
                                                    requirementFlags,
                                                    possibleResources,
                                                    possibleResourceImplementations);

        delete possibleResources;

        if (errorCode != BEAGLE_SUCCESS) {
            delete possibleResourceImplementations;
            return errorCode;
        }

        beagle::BeagleImpl* bestBeagle = NULL;
        errorCode = BEAGLE_ERROR_NO_RESOURCE;

        for(RsrcImplList::iterator it = possibleResourceImplementations->begin(); it != possibleResourceImplementations->end(); ++it) {
            int resource = (*it).second.first;
            beagle::BeagleImplFactory* factory = (*it).second.second;

            bestBeagle = factory->createImpl(tipCount, partialsBufferCount,
                                                                compactBufferCount, stateCount,
                                                                patternCount, eigenBufferCount,
                                                                matrixBufferCount, categoryCount,
                                                                scaleBufferCount,
                                                                resource,
                                                                ResourceMap[resource],
                                                                preferenceFlags,
                                                                requirementFlags,
                                                                &errorCode);

            if (bestBeagle != NULL)
                break;
        }

        delete possibleResourceImplementations;

        if (bestBeagle != NULL) {

            int instance = instances->size();
            instances->push_back(bestBeagle);

            int returnValue = bestBeagle->getInstanceDetails(returnInfo);
            if (returnValue == BEAGLE_SUCCESS) {
                returnInfo->resourceName = rsrcList->list[returnInfo->resourceNumber].name;
                // TODO: move implDescription to inside the implementation
                returnInfo->implDescription = (char*) "none";

                returnValue = instance;
            }
            return returnValue;
        }

        // No implementations found or appropriate, return last error code
        return errorCode;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
    loaded = 1;

}